

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-server.c
# Opt level: O0

void ssh2channel_send_exit_signal_numeric(SshChannel *sc,int signum,_Bool core_dumped,ptrlen msg)

{
  ssh2_connection_state *psVar1;
  PktOut *pPVar2;
  PktOut *pktout;
  ssh2_connection_state *s;
  ssh2_channel *c;
  _Bool core_dumped_local;
  int signum_local;
  SshChannel *sc_local;
  ptrlen msg_local;
  
  psVar1 = ((ssh2_channel *)(sc + -0xb))->connlayer;
  pPVar2 = ssh2_chanreq_init((ssh2_channel *)(sc + -0xb),"exit-signal",(cr_handler_fn_t)0x0,
                             (void *)0x0);
  BinarySink_put_uint32(pPVar2->binarysink_,(long)signum);
  BinarySink_put_bool(pPVar2->binarysink_,core_dumped);
  BinarySink_put_stringpl(pPVar2->binarysink_,msg);
  BinarySink_put_stringz(pPVar2->binarysink_,"");
  pq_base_push(&((psVar1->ppl).out_pq)->pqb,&pPVar2->qnode);
  return;
}

Assistant:

void ssh2channel_send_exit_signal_numeric(
    SshChannel *sc, int signum, bool core_dumped, ptrlen msg)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    struct ssh2_connection_state *s = c->connlayer;

    PktOut *pktout = ssh2_chanreq_init(c, "exit-signal", NULL, NULL);
    put_uint32(pktout, signum);
    put_bool(pktout, core_dumped);
    put_stringpl(pktout, msg);
    put_stringz(pktout, "");           /* language tag */

    pq_push(s->ppl.out_pq, pktout);
}